

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_search_localfile
              (char **searchpaths,int cwd,char *name,char *revision,char **localfile,
              LYS_INFORMAT *format)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ly_set *set;
  size_t __n;
  lys_node *__name;
  long lVar5;
  DIR *pDVar6;
  size_t sVar7;
  dirent *pdVar8;
  size_t sVar9;
  int *piVar10;
  char *pcVar11;
  char *pcVar12;
  LYS_INFORMAT LVar13;
  LYS_INFORMAT LVar14;
  char **ppcVar15;
  ulong uVar16;
  undefined1 local_128 [8];
  stat st;
  long local_60;
  char *local_48;
  char *wn;
  DIR *local_38;
  
  local_48 = (char *)0x0;
  if (localfile == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_search_localfile");
    return 1;
  }
  set = ly_set_new();
  if (set == (ly_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_search_localfile")
    ;
    return 1;
  }
  __n = strlen(name);
  st.__glibc_reserved[2] = (__syscall_slong_t)localfile;
  if (cwd == 0) {
    bVar2 = false;
LAB_0015f13b:
    if ((searchpaths != (char **)0x0) && (pcVar12 = *searchpaths, pcVar12 != (char *)0x0)) {
      ppcVar15 = searchpaths + 1;
      local_38 = (DIR *)0x0;
      do {
        if ((bVar2) && (iVar3 = strcmp((char *)*(set->set).s,pcVar12), iVar3 == 0)) {
          bVar2 = false;
        }
        else {
          __name = (lys_node *)strdup(pcVar12);
          if (__name == (lys_node *)0x0) goto LAB_0015f51b;
          iVar3 = ly_set_add(set,__name,0);
          if (iVar3 == -1) {
            iVar3 = 1;
            goto LAB_0015f5bb;
          }
        }
        pcVar12 = *ppcVar15;
        ppcVar15 = ppcVar15 + 1;
      } while (pcVar12 != (char *)0x0);
    }
    if (set->number == 0) {
      __name = (lys_node *)0x0;
      local_38 = (DIR *)0x0;
      wn = (char *)0x0;
      LVar13 = LYS_IN_UNKNOWN;
    }
    else {
      lVar5 = __n + 1;
      LVar13 = LYS_IN_UNKNOWN;
      wn = (char *)0x0;
      local_60 = 0;
      __name = (lys_node *)0x0;
      pDVar6 = (DIR *)0x0;
      do {
        free(__name);
        free(local_48);
        local_48 = (char *)0x0;
        uVar4 = set->number - 1;
        set->number = uVar4;
        __name = (set->set).s[uVar4];
        (set->set).s[uVar4] = (lys_node *)0x0;
        ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Searching for \"%s\" in %s.",name,__name);
        if (pDVar6 != (DIR *)0x0) {
          closedir(pDVar6);
        }
        pDVar6 = opendir((char *)__name);
        sVar7 = strlen((char *)__name);
        local_38 = pDVar6;
        if (pDVar6 == (DIR *)0x0) {
          piVar10 = __errno_location();
          pcVar12 = strerror(*piVar10);
          ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                 "Unable to open directory \"%s\" for searching (sub)modules (%s).",__name,pcVar12);
        }
        else {
          pdVar8 = readdir(pDVar6);
          if (pdVar8 != (dirent *)0x0) {
            do {
              pcVar12 = pdVar8->d_name;
              iVar3 = strcmp(".",pcVar12);
              if ((iVar3 != 0) && (iVar3 = strcmp("..",pcVar12), iVar3 != 0)) {
                free(local_48);
                iVar3 = asprintf(&local_48,"%s/%s",__name,pcVar12);
                if (iVar3 == -1) {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lys_search_localfile");
LAB_0015f570:
                  iVar3 = 1;
                  pcVar12 = wn;
                  goto LAB_0015f5be;
                }
                iVar3 = stat(local_48,(stat *)local_128);
                if (iVar3 == -1) {
                  piVar10 = __errno_location();
                  pcVar11 = strerror(*piVar10);
                  ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                         "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                         ,pcVar12,__name,pcVar11);
                }
                else if (((uint)st.st_nlink & 0xf000) == 0x8000) {
                  iVar3 = strncmp(name,pcVar12,__n);
                  if ((iVar3 == 0) && ((cVar1 = pcVar12[__n], cVar1 == '@' || (cVar1 == '.')))) {
                    sVar9 = strlen(pcVar12);
                    iVar3 = strcmp(pcVar12 + (sVar9 - 4),".yin");
                    if (iVar3 == 0) {
                      LVar14 = LYS_IN_YIN;
                    }
                    else {
                      iVar3 = strcmp(pcVar12 + (sVar9 - 5),".yang");
                      if (iVar3 != 0) goto LAB_0015f3e1;
                      LVar14 = LYS_IN_YANG;
                    }
                    if (revision == (char *)0x0) {
                      if (wn == (char *)0x0) {
LAB_0015f4bf:
                        wn = local_48;
                        local_48 = (char *)0x0;
                        LVar13 = LVar14;
                        local_60 = sVar7 + lVar5;
                      }
                      else if (cVar1 == '@') {
                        iVar3 = lyp_check_date((ly_ctx *)0x0,pcVar12 + lVar5);
                        if ((iVar3 == 0) &&
                           ((wn[local_60] != '@' ||
                            (iVar3 = strncmp(wn + local_60 + 1,pcVar12 + lVar5,10), iVar3 < 0))))
                        goto LAB_0015f4ba;
                      }
                    }
                    else {
                      if (cVar1 != '@') {
LAB_0015f4ba:
                        free(wn);
                        goto LAB_0015f4bf;
                      }
                      sVar9 = strlen(revision);
                      iVar3 = strncmp(revision,pcVar12 + lVar5,sVar9);
                      if (iVar3 == 0) {
                        free(wn);
                        wn = local_48;
                        local_48 = (char *)0x0;
                        LVar13 = LVar14;
                        goto LAB_0015f587;
                      }
                    }
                  }
                }
                else if ((((uint)st.st_nlink & 0xf000) == 0x4000) && (set->number != 0 || !bVar2)) {
                  iVar3 = ly_set_add(set,local_48,0);
                  if (iVar3 == -1) goto LAB_0015f570;
                  local_48 = (char *)0x0;
                }
              }
LAB_0015f3e1:
              pdVar8 = readdir(local_38);
            } while (pdVar8 != (dirent *)0x0);
          }
        }
        pDVar6 = local_38;
      } while (set->number != 0);
    }
LAB_0015f587:
    *(char **)st.__glibc_reserved[2] = wn;
    if (format == (LYS_INFORMAT *)0x0) {
      iVar3 = 0;
      pcVar12 = (char *)0x0;
      goto LAB_0015f5be;
    }
    *format = LVar13;
    iVar3 = 0;
  }
  else {
    __name = (lys_node *)get_current_dir_name();
    if (__name == (lys_node *)0x0) {
LAB_0015f51b:
      __name = (lys_node *)0x0;
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_search_localfile");
    }
    else {
      iVar3 = ly_set_add(set,__name,0);
      if (iVar3 != -1) {
        bVar2 = true;
        goto LAB_0015f13b;
      }
    }
    iVar3 = 1;
    local_38 = (DIR *)0x0;
  }
LAB_0015f5bb:
  pcVar12 = (char *)0x0;
LAB_0015f5be:
  free(local_48);
  free(__name);
  if (local_38 != (DIR *)0x0) {
    closedir(local_38);
  }
  free(pcVar12);
  if (set->number != 0) {
    uVar16 = 0;
    do {
      free((set->set).s[uVar16]);
      uVar16 = uVar16 + 1;
    } while (uVar16 < set->number);
  }
  ly_set_free(set);
  return iVar3;
}

Assistant:

API int
lys_search_localfile(const char * const *searchpaths, int cwd, const char *name, const char *revision, char **localfile, LYS_INFORMAT *format)
{
    size_t len, flen, match_len = 0, dir_len;
    int i, implicit_cwd = 0, ret = EXIT_FAILURE;
    char *wd, *wn = NULL;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL;
    LYS_INFORMAT format_aux, match_format = 0;
    unsigned int u;
    struct ly_set *dirs;
    struct stat st;

    if (!localfile) {
        LOGARG;
        return EXIT_FAILURE;
    }

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    dirs = ly_set_new();
    if (!dirs) {
        LOGMEM(NULL);
        return EXIT_FAILURE;
    }

    len = strlen(name);
    if (cwd) {
        wd = get_current_dir_name();
        if (!wd) {
            LOGMEM(NULL);
            goto cleanup;
        } else {
            /* add implicit current working directory (./) to be searched,
             * this directory is not searched recursively */
            if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
            implicit_cwd = 1;
        }
    }
    if (searchpaths) {
        for (i = 0; searchpaths[i]; i++) {
            /* check for duplicities with the implicit current working directory */
            if (implicit_cwd && !strcmp(dirs->set.g[0], searchpaths[i])) {
                implicit_cwd = 0;
                continue;
            }
            wd = strdup(searchpaths[i]);
            if (!wd) {
                LOGMEM(NULL);
                goto cleanup;
            } else if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->number) {
        free(wd);
        free(wn); wn = NULL;

        dirs->number--;
        wd = (char *)dirs->set.g[dirs->number];
        dirs->set.g[dirs->number] = NULL;
        LOGVRB("Searching for \"%s\" in %s.", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN(NULL, "Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
        } else {
            while ((file = readdir(dir))) {
                if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                    /* skip . and .. */
                    continue;
                }
                free(wn);
                if (asprintf(&wn, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM(NULL);
                    goto cleanup;
                }
                if (stat(wn, &st) == -1) {
                    LOGWRN(NULL, "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)",
                           file->d_name, wd, strerror(errno));
                    continue;
                }
                if (S_ISDIR(st.st_mode) && (dirs->number || !implicit_cwd)) {
                    /* we have another subdirectory in searchpath to explore,
                     * subdirectories are not taken into account in current working dir (dirs->set.g[0]) */
                    if (ly_set_add(dirs, wn, 0) == -1) {
                        goto cleanup;
                    }
                    /* continue with the next item in current directory */
                    wn = NULL;
                    continue;
                } else if (!S_ISREG(st.st_mode)) {
                    /* not a regular file (note that we see the target of symlinks instead of symlinks */
                    continue;
                }

                /* here we know that the item is a file which can contain a module */
                if (strncmp(name, file->d_name, len) ||
                        (file->d_name[len] != '.' && file->d_name[len] != '@')) {
                    /* different filename than the module we search for */
                    continue;
                }

                /* get type according to filename suffix */
                flen = strlen(file->d_name);
                if (!strcmp(&file->d_name[flen - 4], ".yin")) {
                    format_aux = LYS_IN_YIN;
                } else if (!strcmp(&file->d_name[flen - 5], ".yang")) {
                    format_aux = LYS_IN_YANG;
                } else {
                    /* not supportde suffix/file format */
                    continue;
                }

                if (revision) {
                    /* we look for the specific revision, try to get it from the filename */
                    if (file->d_name[len] == '@') {
                        /* check revision from the filename */
                        if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                            /* another revision */
                            continue;
                        } else {
                            /* exact revision */
                            free(match_name);
                            match_name = wn;
                            wn = NULL;
                            match_len = dir_len + 1 + len;
                            match_format = format_aux;
                            goto success;
                        }
                    } else {
                        /* continue trying to find exact revision match, use this only if not found */
                        free(match_name);
                        match_name = wn;
                        wn = NULL;
                        match_len = dir_len + 1 +len;
                        match_format = format_aux;
                        continue;
                    }
                } else {
                    /* remember the revision and try to find the newest one */
                    if (match_name) {
                        if (file->d_name[len] != '@' || lyp_check_date(NULL, &file->d_name[len + 1])) {
                            continue;
                        } else if (match_name[match_len] == '@' &&
                                (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                            continue;
                        }
                        free(match_name);
                    }

                    match_name = wn;
                    wn = NULL;
                    match_len = dir_len + 1 + len;
                    match_format = format_aux;
                    continue;
                }
            }
        }
    }

success:
    (*localfile) = match_name;
    match_name = NULL;
    if (format) {
        (*format) = match_format;
    }
    ret = EXIT_SUCCESS;

cleanup:
    free(wn);
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    for (u = 0; u < dirs->number; u++) {
        free(dirs->set.g[u]);
    }
    ly_set_free(dirs);

    return ret;
}